

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# L2NormCost.cpp
# Opt level: O1

void __thiscall
iDynTree::optimalcontrol::CostAttributes::initializeBuffers
          (CostAttributes *this,uint rangeSize,uint totalDimension)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  CostAttributes *pCVar3;
  variable_if_dynamic<long,__1> vVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  undefined8 *puVar8;
  long lVar9;
  long lVar10;
  PointerType pdVar11;
  PointerType pdVar12;
  long lVar13;
  ulong uVar14;
  undefined8 *puVar15;
  long lVar16;
  ulong uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined8 uVar21;
  assign_op<double,_double> local_b1;
  undefined8 local_b0;
  undefined8 local_a8;
  CostAttributes *local_a0;
  Product<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
  local_98;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_50;
  
  local_98.m_lhs.m_matrix.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
  .m_rows.m_value =
       (long)local_98.m_lhs.m_matrix.
             super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_data;
  iDynTree::VectorDynSize::resize((ulong)&this->buffer);
  iDynTree::VectorDynSize::zero();
  local_98.m_lhs.m_matrix.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
  .m_data = (PointerType)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::VectorDynSize>,std::allocator<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::VectorDynSize>>,iDynTree::VectorDynSize&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&local_98 + 8),
             (TimeInvariantObject<iDynTree::VectorDynSize> **)&local_98,
             (allocator<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::VectorDynSize>_> *)
             &local_50,&this->buffer);
  vVar4.m_value =
       local_98.m_lhs.m_matrix.
       super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_rows.m_value;
  pdVar11 = local_98.m_lhs.m_matrix.
            super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_data;
  local_98.m_lhs.m_matrix.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
  .m_data = (PointerType)0x0;
  local_98.m_lhs.m_matrix.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
  .m_rows.m_value = 0;
  this_00 = (this->desiredTrajectory).
            super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  (this->desiredTrajectory).
  super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)pdVar11;
  (this->desiredTrajectory).
  super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)vVar4.m_value;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_98.m_lhs.m_matrix.
      super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_98.m_lhs.m_matrix.
               super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_rows.m_value);
  }
  iDynTree::MatrixDynSize::resize((ulong)&this->weightMatrix,(ulong)rangeSize);
  lVar5 = iDynTree::MatrixDynSize::data();
  uVar6 = iDynTree::MatrixDynSize::rows();
  lVar7 = iDynTree::MatrixDynSize::cols();
  auVar2 = _DAT_001819f0;
  auVar1 = _DAT_001819e0;
  if (0 < (long)uVar6) {
    lVar9 = lVar7 + -1;
    auVar18._8_4_ = (int)lVar9;
    auVar18._0_8_ = lVar9;
    auVar18._12_4_ = (int)((ulong)lVar9 >> 0x20);
    lVar5 = lVar5 + 8;
    uVar14 = 0;
    auVar18 = auVar18 ^ _DAT_001819f0;
    do {
      if (0 < lVar7) {
        uVar17 = 0;
        auVar19 = auVar1;
        do {
          auVar20 = auVar19 ^ auVar2;
          if ((bool)(~(auVar18._4_4_ < auVar20._4_4_ ||
                      auVar18._0_4_ < auVar20._0_4_ && auVar20._4_4_ == auVar18._4_4_) & 1)) {
            uVar21 = 0x3ff0000000000000;
            if (uVar14 != uVar17) {
              uVar21 = 0;
            }
            *(undefined8 *)(lVar5 + -8 + uVar17 * 8) = uVar21;
          }
          if (auVar20._12_4_ <= auVar18._12_4_ &&
              (auVar20._8_4_ <= auVar18._8_4_ || auVar20._12_4_ != auVar18._12_4_)) {
            uVar21 = 0x3ff0000000000000;
            if (uVar14 - 1 != uVar17) {
              uVar21 = 0;
            }
            *(undefined8 *)(lVar5 + uVar17 * 8) = uVar21;
          }
          uVar17 = uVar17 + 2;
          lVar9 = auVar19._8_8_;
          auVar19._0_8_ = auVar19._0_8_ + 2;
          auVar19._8_8_ = lVar9 + 2;
        } while ((lVar7 + 1U & 0xfffffffffffffffe) != uVar17);
      }
      uVar14 = uVar14 + 1;
      lVar5 = lVar5 + lVar7 * 8;
    } while (uVar14 != uVar6);
  }
  iDynTree::MatrixDynSize::resize((ulong)&this->gradientSubMatrix,(ulong)totalDimension);
  local_a0 = this;
  (*((this->selector).
     super___shared_ptr<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_Selector[3])();
  puVar8 = (undefined8 *)iDynTree::MatrixDynSize::data();
  iDynTree::MatrixDynSize::rows();
  lVar5 = iDynTree::MatrixDynSize::cols();
  lVar7 = iDynTree::MatrixDynSize::data();
  lVar9 = iDynTree::MatrixDynSize::rows();
  lVar10 = iDynTree::MatrixDynSize::cols();
  pCVar3 = local_a0;
  if (0 < lVar9) {
    lVar13 = 0;
    do {
      if (0 < lVar10) {
        lVar16 = 0;
        puVar15 = puVar8;
        do {
          *(undefined8 *)(lVar7 + lVar16 * 8) = *puVar15;
          lVar16 = lVar16 + 1;
          puVar15 = puVar15 + lVar5;
        } while (lVar10 != lVar16);
      }
      lVar13 = lVar13 + 1;
      puVar8 = puVar8 + 1;
      lVar7 = lVar7 + lVar10 * 8;
    } while (lVar13 != lVar9);
  }
  iDynTree::MatrixDynSize::resize((ulong)&local_a0->hessianMatrix,(ulong)totalDimension);
  (*((pCVar3->selector).
     super___shared_ptr<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_Selector[3])();
  local_a8 = iDynTree::MatrixDynSize::data();
  local_b0 = iDynTree::MatrixDynSize::rows();
  lVar5 = iDynTree::MatrixDynSize::cols();
  (*((pCVar3->selector).
     super___shared_ptr<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_Selector[3])();
  pdVar11 = (PointerType)iDynTree::MatrixDynSize::data();
  lVar7 = iDynTree::MatrixDynSize::rows();
  local_98.m_rhs.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
  .m_cols.m_value = iDynTree::MatrixDynSize::cols();
  local_98.m_lhs.m_matrix.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
  .m_rows.m_value = local_b0;
  local_98.m_lhs.m_matrix.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
  .m_data = (PointerType)local_a8;
  local_98.m_lhs.m_matrix.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
  .m_cols.m_value = lVar5;
  local_98.m_rhs.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
  .m_data = pdVar11;
  local_98.m_rhs.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
  .m_rows.m_value = lVar7;
  pdVar12 = (PointerType)iDynTree::MatrixDynSize::data();
  lVar5 = iDynTree::MatrixDynSize::rows();
  local_50.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_cols.m_value = iDynTree::MatrixDynSize::cols();
  local_50.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = pdVar12;
  local_50.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_rows.m_value = lVar5;
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::Stride<0,0>>>,Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::Stride<0,0>>,0>,Eigen::internal::assign_op<double,double>>
            (&local_50,&local_98,&local_b1,(type)0x0);
  pCVar3->m_valid = true;
  return;
}

Assistant:

void initializeBuffers(unsigned int rangeSize, unsigned int totalDimension) {
                this->buffer.resize(rangeSize);
                this->buffer.zero();
                this->desiredTrajectory = std::make_shared<TimeInvariantVector>(this->buffer);
                this->weightMatrix.resize(rangeSize, rangeSize);
                toEigen(this->weightMatrix).setIdentity();
                this->gradientSubMatrix.resize(totalDimension, rangeSize);
                toEigen(this->gradientSubMatrix) = toEigen(this->selector->asSelectorMatrix()).transpose();
                this->hessianMatrix.resize(totalDimension, totalDimension);
                toEigen(this->hessianMatrix) = toEigen(this->selector->asSelectorMatrix()).transpose() * toEigen(this->selector->asSelectorMatrix());
                this->m_valid = true;
            }